

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Satoko(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_a0 [8];
  satoko_opts_t opts;
  uint local_30;
  int fIncrem;
  int fSplit;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_30 = 0;
  opts.verbose = '\0';
  opts.no_simplify = '\0';
  opts._102_2_ = 0;
  satoko_default_opts((satoko_opts_t *)local_a0);
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Csivh");
      if (iVar1 == -1) {
        if (argc == globalUtilOptind + 1) {
          Gia_ManSatokoDimacs(argv[globalUtilOptind],(satoko_opts_t *)local_a0);
          return 0;
        }
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Satoko(): There is no AIG.\n");
          return 1;
        }
        Gia_ManSatokoCall(pAbc->pGia,(satoko_opts_t *)local_a0,local_30,opts._100_4_);
        return 0;
      }
      if (iVar1 == 0x43) break;
      if (iVar1 == 0x68) goto LAB_0029296d;
      if (iVar1 == 0x69) {
        opts._100_4_ = opts._100_4_ ^ 1;
      }
      else if (iVar1 == 0x73) {
        local_30 = local_30 ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_0029296d;
        opts.clause_min_lbd_bin_resol._0_1_ = (byte)opts.clause_min_lbd_bin_resol ^ 1;
      }
    }
    if (argc <= globalUtilOptind) break;
    iVar1 = atoi(argv[globalUtilOptind]);
    local_a0 = (undefined1  [8])(long)iVar1;
    globalUtilOptind = globalUtilOptind + 1;
    if ((long)local_a0 < 0) {
LAB_0029296d:
      Abc_Print(-2,"usage: &satoko [-C num] [-sivh] <file.cnf>\n");
      Abc_Print(-2,"\t             run Satoko by Bruno Schmitt\n");
      Abc_Print(-2,"\t-C num     : limit on the number of conflicts [default = %d]\n",local_a0);
      pcVar2 = "no";
      if (local_30 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,
                "\t-s         : split multi-output miter into individual outputs [default = %s]\n",
                pcVar2);
      pcVar2 = "no";
      if (opts._100_4_ != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,
                "\t-i         : split multi-output miter and solve incrementally [default = %s]\n",
                pcVar2);
      pcVar2 = "no";
      if ((byte)opts.clause_min_lbd_bin_resol != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v         : prints verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t<file.cnf> : (optional) CNF file to solve\n");
      Abc_Print(-2,"\t-h         : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
  goto LAB_0029296d;
}

Assistant:

int Abc_CommandAbc9Satoko( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManSatokoDimacs( char * pFileName, satoko_opts_t * opts );
    extern void Gia_ManSatokoCall( Gia_Man_t * p, satoko_opts_t * opts, int fSplit, int fIncrem );
    int c, fSplit = 0, fIncrem = 0;

    satoko_opts_t opts;
    satoko_default_opts(&opts);
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Csivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            opts.conf_limit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( opts.conf_limit < 0 )
                goto usage;
            break;
        case 's':
            fSplit ^= 1;
            break;
        case 'i':
            fIncrem ^= 1;
            break;
        case 'v':
            opts.verbose ^= 1;
            break;
        case 'h':
            goto usage;

        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
    {
        Gia_ManSatokoDimacs( argv[globalUtilOptind], &opts );
        return 0;
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Satoko(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManSatokoCall( pAbc->pGia, &opts, fSplit, fIncrem );
    return 0;

usage:
    Abc_Print( -2, "usage: &satoko [-C num] [-sivh] <file.cnf>\n" );
    Abc_Print( -2, "\t             run Satoko by Bruno Schmitt\n" );
    Abc_Print( -2, "\t-C num     : limit on the number of conflicts [default = %d]\n", opts.conf_limit );
    Abc_Print( -2, "\t-s         : split multi-output miter into individual outputs [default = %s]\n", fSplit? "yes": "no" );
    Abc_Print( -2, "\t-i         : split multi-output miter and solve incrementally [default = %s]\n", fIncrem? "yes": "no" );
    Abc_Print( -2, "\t-v         : prints verbose information [default = %s]\n", opts.verbose? "yes": "no" );
    Abc_Print( -2, "\t<file.cnf> : (optional) CNF file to solve\n");
    Abc_Print( -2, "\t-h         : print the command usage\n");
    return 1;
}